

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ArrayDistanceFun::GetFunctions(void)

{
  LogicalType *other;
  scalar_function_t *this;
  scalar_function_t *__x;
  LogicalType varargs;
  LogicalType varargs_00;
  vector<duckdb::ScalarFunction,_true> *this_00;
  NotImplementedException *this_01;
  scalar_function_t *this_02;
  long lVar1;
  bind_scalar_function_t *pp_Var2;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var3;
  LogicalType *child;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType array;
  ScalarFunction function;
  undefined4 in_stack_fffffffffffffa74;
  undefined4 in_stack_fffffffffffffa7c;
  FunctionNullHandling in_stack_fffffffffffffa88;
  allocator_type local_571;
  code *pcVar5;
  LogicalType local_518;
  vector<duckdb::LogicalType,_true> local_500;
  bind_scalar_function_t *local_4e8;
  bind_scalar_function_t *local_4e0;
  LogicalType *local_4d8;
  LogicalType *local_4d0;
  LogicalType *local_4c8;
  LogicalType *local_4c0;
  LogicalType *local_4b8;
  LogicalType local_4a8;
  LogicalType local_490;
  string local_478;
  ScalarFunction local_458;
  undefined1 local_330 [176];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar4 = 0;
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"array_distance","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  LogicalType::Real();
  local_4c8 = local_4b8;
  if (local_4c0 != local_4b8) {
    local_4d8 = &local_280.super_BaseScalarFunction.return_type;
    other = &local_458.super_BaseScalarFunction.return_type;
    this = &local_280.function;
    __x = &local_458.function;
    local_4e8 = &local_280.bind;
    local_4d0 = &local_158.super_BaseScalarFunction.return_type;
    this_02 = &local_158.function;
    local_4e0 = &local_158.bind;
    this_00 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    child = local_4c0;
    do {
      LogicalType::ARRAY(&local_490,child,(optional_idx)0xffffffffffffffff);
      if (child->id_ == DOUBLE) {
        LogicalType::LogicalType((LogicalType *)local_330,&local_490);
        LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&local_490);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_330;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_500,
                   __l_00,&local_571);
        LogicalType::LogicalType(&local_518,child);
        pcVar5 = ArrayGenericFold<double,duckdb::DistanceOp>;
        LogicalType::LogicalType(&local_4a8,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_4a8;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffa74;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffa7c;
        ScalarFunction::ScalarFunction
                  (&local_458,&local_500,&local_518,(scalar_function_t *)&stack0xfffffffffffffa90,
                   ArrayGenericBinaryBind,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                   in_stack_fffffffffffffa88,pcVar5);
        LogicalType::~LogicalType(&local_4a8);
        ::std::
        _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
        ::_M_manager((_Any_data *)&stack0xfffffffffffffa90,(_Any_data *)&stack0xfffffffffffffa90,
                     __destroy_functor);
        LogicalType::~LogicalType(&local_518);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_500);
        lVar1 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,&local_458.super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_280,(SimpleFunction *)&local_458);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__BaseScalarFunction_01968bd0;
        LogicalType::LogicalType(local_4d8,other);
        local_280.super_BaseScalarFunction.stability = local_458.super_BaseScalarFunction.stability;
        local_280.super_BaseScalarFunction.null_handling =
             local_458.super_BaseScalarFunction.null_handling;
        local_280.super_BaseScalarFunction.errors = local_458.super_BaseScalarFunction.errors;
        local_280.super_BaseScalarFunction.collation_handling =
             local_458.super_BaseScalarFunction.collation_handling;
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function(this,__x);
        pp_Var2 = &local_458.bind;
        pp_Var3 = local_4e8;
        for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
          *pp_Var3 = *pp_Var2;
          pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
          pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
        }
        local_280.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_280.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_458.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_458.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_458.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this_00->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_280);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        if (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_280.function.super__Function_base._M_manager)
                    ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
        local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        if (local_458.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_458.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_458.function.super__Function_base._M_manager)
                    ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
        }
      }
      else {
        if (child->id_ != FLOAT) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)
               &local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                _M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_458,"Array function not implemented for type %s","");
          LogicalType::ToString_abi_cxx11_((string *)local_330,child);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_01,(string *)&local_458,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330)
          ;
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        LogicalType::LogicalType((LogicalType *)local_330,&local_490);
        LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&local_490);
        __l._M_len = 2;
        __l._M_array = (iterator)local_330;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_500,
                   __l,&local_571);
        LogicalType::LogicalType(&local_518,child);
        pcVar5 = ArrayGenericFold<float,duckdb::DistanceOp>;
        LogicalType::LogicalType(&local_4a8,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_4a8;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffa74;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffa7c;
        ScalarFunction::ScalarFunction
                  (&local_458,&local_500,&local_518,(scalar_function_t *)&stack0xfffffffffffffa90,
                   ArrayGenericBinaryBind,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                   in_stack_fffffffffffffa88,pcVar5);
        LogicalType::~LogicalType(&local_4a8);
        ::std::
        _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
        ::_M_manager((_Any_data *)&stack0xfffffffffffffa90,(_Any_data *)&stack0xfffffffffffffa90,
                     __destroy_functor);
        LogicalType::~LogicalType(&local_518);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_500);
        lVar1 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,&local_458.super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)&local_458);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__BaseScalarFunction_01968bd0;
        LogicalType::LogicalType(local_4d0,other);
        local_158.super_BaseScalarFunction.stability = local_458.super_BaseScalarFunction.stability;
        local_158.super_BaseScalarFunction.null_handling =
             local_458.super_BaseScalarFunction.null_handling;
        local_158.super_BaseScalarFunction.errors = local_458.super_BaseScalarFunction.errors;
        local_158.super_BaseScalarFunction.collation_handling =
             local_458.super_BaseScalarFunction.collation_handling;
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function(this_02,__x);
        pp_Var2 = &local_458.bind;
        pp_Var3 = local_4e0;
        for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
          *pp_Var3 = *pp_Var2;
          pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
          pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
        }
        local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_458.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_458.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_458.function_info.internal.
             super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_458.function_info.internal.
                  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this_00->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    ((_Any_data *)this_02,(_Any_data *)this_02,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_019684c8;
        if (local_458.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_458.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_458.function.super__Function_base._M_manager)
                    ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
        }
      }
      BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_490);
      child = child + 1;
    } while (child != local_4c8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4c0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ArrayDistanceFun::GetFunctions() {
	ScalarFunctionSet set("array_distance");
	for (auto &type : LogicalType::Real()) {
		AddArrayFoldFunction<DistanceOp>(set, type);
	}
	return set;
}